

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.h
# Opt level: O3

int secp256k1_musig_aggnonce_load
              (secp256k1_context *ctx,secp256k1_ge *ges,secp256k1_musig_aggnonce *nonce)

{
  uchar uVar1;
  uchar uVar2;
  long lVar3;
  uchar *p1;
  bool bVar4;
  
  lVar3 = 0;
  do {
    uVar1 = nonce->data[lVar3];
    uVar2 = secp256k1_musig_aggnonce_magic[lVar3];
    if (uVar1 != uVar2) break;
    bVar4 = lVar3 != 3;
    lVar3 = lVar3 + 1;
  } while (bVar4);
  if (uVar1 != uVar2) {
    secp256k1_musig_aggnonce_load_cold_1();
  }
  else {
    secp256k1_ge_from_bytes_ext(ges,nonce->data + 4);
    secp256k1_ge_from_bytes_ext(ges + 1,nonce->data + 0x44);
  }
  return (uint)(uVar1 == uVar2);
}

Assistant:

static int secp256k1_musig_aggnonce_load(const secp256k1_context* ctx, secp256k1_ge* ges, const secp256k1_musig_aggnonce* nonce) {
    int i;

    ARG_CHECK(secp256k1_memcmp_var(&nonce->data[0], secp256k1_musig_aggnonce_magic, 4) == 0);
    for (i = 0; i < 2; i++) {
        secp256k1_ge_from_bytes_ext(&ges[i], &nonce->data[4 + 64*i]);
    }
    return 1;
}